

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

action __thiscall
Search::search::predict
          (search *this,example *ec,ptag mytag,action *oracle_actions,size_t oracle_actions_cnt,
          ptag *condition_on,char *condition_on_names,action *allowed_actions,
          size_t allowed_actions_cnt,float *allowed_actions_cost,size_t learner_id,float weight)

{
  action_repr *paVar1;
  features *this_00;
  search_private *psVar2;
  action *pos;
  ulong uVar3;
  float loss;
  action_repr item;
  action a;
  float a_cost;
  action_repr local_40;
  
  a_cost = 0.0;
  pos = oracle_actions;
  a = search_predict(this->priv,ec,1,mytag,oracle_actions,oracle_actions_cnt,condition_on,
                     condition_on_names,allowed_actions,allowed_actions_cnt,allowed_actions_cost,
                     learner_id,&a_cost,weight);
  if (this->priv->state == INIT_TEST) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->priv->test_action_sequence,&a);
  }
  if (mytag != 0) {
    uVar3 = (ulong)mytag;
    psVar2 = this->priv;
    paVar1 = (psVar2->ptag_to_action)._begin;
    if (uVar3 < (ulong)((long)(psVar2->ptag_to_action)._end - (long)paVar1 >> 4)) {
      this_00 = paVar1[uVar3].repr;
      if (this_00 != (features *)0x0) {
        features::delete_v(this_00);
        operator_delete((this->priv->ptag_to_action)._begin[uVar3].repr);
        psVar2 = this->priv;
      }
    }
    if ((psVar2->acset).use_passthrough_repr == true) {
      action_repr::action_repr(&local_40,a,&psVar2->last_action_repr);
    }
    else {
      local_40.repr = (features *)0x0;
      local_40.a = a;
    }
    item.repr._0_4_ = mytag;
    item._0_8_ = local_40.repr;
    item.repr._4_4_ = 0;
    push_at<Search::action_repr>
              ((Search *)&psVar2->ptag_to_action,(v_array<Search::action_repr> *)(ulong)local_40.a,
               item,(size_t)pos);
  }
  if (this->priv->auto_hamming_loss == true) {
    if (this->priv->use_action_costs == true) {
      loss = action_cost_loss(a,allowed_actions,allowed_actions_cost,allowed_actions_cnt);
    }
    else {
      loss = action_hamming_loss(a,oracle_actions,oracle_actions_cnt);
    }
    search::loss(this,loss);
  }
  return a;
}

Assistant:

action search::predict(example& ec, ptag mytag, const action* oracle_actions, size_t oracle_actions_cnt,
    const ptag* condition_on, const char* condition_on_names, const action* allowed_actions, size_t allowed_actions_cnt,
    const float* allowed_actions_cost, size_t learner_id, float weight)
{
  float a_cost = 0.;
  action a = search_predict(*priv, &ec, 1, mytag, oracle_actions, oracle_actions_cnt, condition_on, condition_on_names,
      allowed_actions, allowed_actions_cnt, allowed_actions_cost, learner_id, a_cost, weight);
  if (priv->state == INIT_TEST)
    priv->test_action_sequence.push_back(a);
  if (mytag != 0)
  {
    if (mytag < priv->ptag_to_action.size())
    {
      cdbg << "delete_v at " << mytag << endl;
      if (priv->ptag_to_action[mytag].repr != nullptr)
      {
        priv->ptag_to_action[mytag].repr->delete_v();
        delete priv->ptag_to_action[mytag].repr;
      }
    }
    if (priv->acset.use_passthrough_repr)
    {
      assert((mytag >= priv->ptag_to_action.size()) || (priv->ptag_to_action[mytag].repr == nullptr));
      push_at(priv->ptag_to_action, action_repr(a, &(priv->last_action_repr)), mytag);
    }
    else
      push_at(priv->ptag_to_action, action_repr(a, (features*)nullptr), mytag);
    cdbg << "push_at " << mytag << endl;
  }
  if (priv->auto_hamming_loss)
    loss(priv->use_action_costs ? action_cost_loss(a, allowed_actions, allowed_actions_cost, allowed_actions_cnt)
                                : action_hamming_loss(a, oracle_actions, oracle_actions_cnt));
  cdbg << "predict returning " << a << endl;
  return a;
}